

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Exception::Exception(Exception *this,String *msg)

{
  String *msg_local;
  Exception *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__Exception_001b1bb8;
  std::__cxx11::string::string((string *)&this->msg_,(string *)msg);
  return;
}

Assistant:

Exception::Exception(String msg) : msg_(std::move(msg)) {}